

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_policy.cpp
# Opt level: O0

ValuedAction __thiscall
despot::DefaultPolicy::RecursiveValue
          (DefaultPolicy *this,vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
          RandomStreams *streams,History *history)

{
  value_type pSVar1;
  DSPOMDP *pDVar2;
  bool bVar3;
  uint action_00;
  uint uVar4;
  size_t sVar5;
  ulong uVar6;
  size_type sVar7;
  const_reference ppSVar8;
  mapped_type *this_00;
  pointer ppVar9;
  double extraout_XMM0_Qa;
  double dVar10;
  ValuedAction VVar11;
  ValuedAction va;
  OBS_TYPE obs_1;
  _Self local_b8;
  iterator it;
  value_type pSStack_98;
  bool terminal;
  State *particle;
  double dStack_88;
  int i;
  double reward;
  OBS_TYPE obs;
  map<unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>_>
  partitions;
  double value;
  ACT_TYPE action;
  History *history_local;
  RandomStreams *streams_local;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *particles_local;
  DefaultPolicy *this_local;
  double local_10;
  
  bVar3 = RandomStreams::Exhausted(streams);
  if (!bVar3) {
    sVar5 = History::Size(history);
    if (sVar5 - (long)this->initial_depth_ < (ulong)(long)DAT_00278a74) {
      action_00 = (*(this->super_ScenarioLowerBound)._vptr_ScenarioLowerBound[6])
                            (this,particles,streams,history);
      partitions._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      std::
      map<unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>_>
      ::map((map<unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>_>
             *)&obs);
      particle._4_4_ = 0;
      while( true ) {
        uVar6 = (ulong)particle._4_4_;
        sVar7 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size(particles);
        if (sVar7 <= uVar6) break;
        ppSVar8 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                            (particles,(long)particle._4_4_);
        pSVar1 = *ppSVar8;
        pDVar2 = (this->super_ScenarioLowerBound).model_;
        pSStack_98 = pSVar1;
        dVar10 = RandomStreams::Entry(streams,pSVar1->scenario_id);
        uVar4 = (*pDVar2->_vptr_DSPOMDP[2])
                          (dVar10,pDVar2,pSVar1,(ulong)action_00,&stack0xffffffffffffff78,&reward);
        partitions._M_t._M_impl.super__Rb_tree_header._M_node_count =
             (size_t)(dStack_88 * pSStack_98->weight +
                     (double)partitions._M_t._M_impl.super__Rb_tree_header._M_node_count);
        if ((uVar4 & 1) == 0) {
          this_00 = std::
                    map<unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>_>
                    ::operator[]((map<unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>_>
                                  *)&obs,(key_type *)&reward);
          std::vector<despot::State_*,_std::allocator<despot::State_*>_>::push_back
                    (this_00,&stack0xffffffffffffff68);
        }
        particle._4_4_ = particle._4_4_ + 1;
      }
      local_b8._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>_>
           ::begin((map<unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>_>
                    *)&obs);
      while( true ) {
        obs_1 = (OBS_TYPE)
                std::
                map<unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>_>
                ::end((map<unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>_>
                       *)&obs);
        bVar3 = std::operator!=(&local_b8,(_Self *)&obs_1);
        if (!bVar3) break;
        ppVar9 = std::
                 _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>
                 ::operator->(&local_b8);
        History::Add(history,action_00,ppVar9->first);
        RandomStreams::Advance(streams);
        ppVar9 = std::
                 _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>
                 ::operator->(&local_b8);
        VVar11 = RecursiveValue(this,&ppVar9->second,streams,history);
        dVar10 = Globals::Discount();
        partitions._M_t._M_impl.super__Rb_tree_header._M_node_count =
             (size_t)(dVar10 * VVar11.value +
                     (double)partitions._M_t._M_impl.super__Rb_tree_header._M_node_count);
        RandomStreams::Back(streams);
        History::RemoveLast(history);
        std::
        _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>
        ::operator++(&local_b8,0);
      }
      ValuedAction::ValuedAction
                ((ValuedAction *)&this_local,action_00,
                 (double)partitions._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      map<unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>_>
      ::~map((map<unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>_>
              *)&obs);
      goto LAB_001b9293;
    }
  }
  this_local._0_4_ =
       (*(this->particle_lower_bound_->super_ScenarioLowerBound)._vptr_ScenarioLowerBound[6])
                 (this->particle_lower_bound_,particles);
  local_10 = extraout_XMM0_Qa;
LAB_001b9293:
  VVar11._4_4_ = 0;
  VVar11.action = (uint)this_local;
  VVar11.value = local_10;
  return VVar11;
}

Assistant:

ValuedAction DefaultPolicy::RecursiveValue(const vector<State*>& particles,
	RandomStreams& streams, History& history) const {
	if (streams.Exhausted()
		|| (history.Size() - initial_depth_
			>= Globals::config.max_policy_sim_len)) {
		return particle_lower_bound_->Value(particles);
	} else {
		ACT_TYPE action = Action(particles, streams, history);

		double value = 0;

		map<OBS_TYPE, vector<State*> > partitions;
		OBS_TYPE obs;
		double reward;
		for (int i = 0; i < particles.size(); i++) {
			State* particle = particles[i];
			bool terminal = model_->Step(*particle,
				streams.Entry(particle->scenario_id), action, reward, obs);

			value += reward * particle->weight;

			if (!terminal) {
				partitions[obs].push_back(particle);
			}
		}

		for (map<OBS_TYPE, vector<State*> >::iterator it = partitions.begin();
			it != partitions.end(); it++) {
			OBS_TYPE obs = it->first;
			history.Add(action, obs);
			streams.Advance();
			ValuedAction va = RecursiveValue(it->second, streams, history);
			value += Globals::Discount() * va.value;
			streams.Back();
			history.RemoveLast();
		}

		return ValuedAction(action, value);
	}
}